

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Promise<void> __thiscall
capnp::anon_unknown_69::WindowFlowController::waitAllAcked(WindowFlowController *this)

{
  SourceLocation location;
  undefined8 unaff_RBX;
  long in_RSI;
  undefined8 unaff_R14;
  PromiseFulfillerPair<kj::Promise<void>_> paf;
  Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t> local_48;
  OwnPromiseNode local_30;
  Disposer *local_28;
  PromiseFulfiller<kj::Promise<void>_> *in_stack_ffffffffffffffe0;
  
  if ((*(int *)(in_RSI + 0x28) == 1) && (*(long *)(in_RSI + 0x38) != *(long *)(in_RSI + 0x30))) {
    location.function = (char *)unaff_RBX;
    location.fileName = (char *)in_stack_ffffffffffffffe0;
    location._16_8_ = unaff_R14;
    kj::newPromiseAndFulfiller<kj::Promise<void>>(location);
    local_48.disposer = local_28;
    kj::Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t>::operator=
              ((Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t> *)(in_RSI + 0x1c0),
               &local_48);
    kj::Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t>::dispose(&local_48);
    (this->super_RpcFlowController)._vptr_RpcFlowController = (_func_int **)local_30.ptr;
    local_30.ptr = (PromiseNode *)0x0;
    kj::PromiseFulfillerPair<kj::Promise<void>_>::~PromiseFulfillerPair
              ((PromiseFulfillerPair<kj::Promise<void>_> *)&local_30);
  }
  else {
    kj::TaskSet::onEmpty((TaskSet *)this);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> waitAllAcked() override {
    KJ_IF_SOME(q, state.tryGet<Running>()) {
      if (!q.empty()) {
        auto paf = kj::newPromiseAndFulfiller<kj::Promise<void>>();
        emptyFulfiller = kj::mv(paf.fulfiller);
        return kj::mv(paf.promise);
      }
    }
    return tasks.onEmpty();
  }